

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstrie.cpp
# Opt level: O1

UStringTrieResult __thiscall icu_63::UCharsTrie::nextImpl(UCharsTrie *this,UChar *pos,int32_t uchar)

{
  UChar UVar1;
  UChar UVar2;
  UStringTrieResult UVar3;
  UStringTrieResult UVar4;
  UChar *pos_00;
  
  UVar1 = *pos;
  pos_00 = pos + 1;
  UVar3 = (uint)(ushort)UVar1;
  if (0x2f < (ushort)UVar1) {
    UVar3 = (ushort)UVar1 & 0x3f;
    UVar4 = (uint)(ushort)UVar1;
    do {
      if (UVar4 < 0x40) {
        UVar1 = *pos_00;
        if ((uint)(ushort)UVar1 == uchar) {
          this->remainingMatchLength_ = UVar4 - 0x31;
          this->pos_ = pos_00 + 1;
          UVar3 = USTRINGTRIE_NO_VALUE;
          if ((UVar4 == 0x30) && (UVar2 = pos_00[1], 0x3f < (ushort)UVar2)) {
            UVar3 = (ushort)UVar2 >> 0xf ^ USTRINGTRIE_INTERMEDIATE_VALUE;
          }
        }
        if ((uint)(ushort)UVar1 == uchar) {
          return UVar3;
        }
LAB_002ad6dc:
        this->pos_ = (char16_t *)0x0;
        return USTRINGTRIE_NO_MATCH;
      }
      if (0x7fff < UVar4) goto LAB_002ad6dc;
      if (0x403f < UVar4) {
        if (UVar4 < 0x7fc0) {
          pos_00 = pos_00 + 1;
        }
        else {
          pos_00 = pos_00 + 2;
        }
      }
      UVar4 = UVar3;
    } while (0x2f < UVar3);
  }
  UVar3 = branchNext(this,pos_00,UVar3,uchar);
  return UVar3;
}

Assistant:

UStringTrieResult
UCharsTrie::nextImpl(const UChar *pos, int32_t uchar) {
    int32_t node=*pos++;
    for(;;) {
        if(node<kMinLinearMatch) {
            return branchNext(pos, node, uchar);
        } else if(node<kMinValueLead) {
            // Match the first of length+1 units.
            int32_t length=node-kMinLinearMatch;  // Actual match length minus 1.
            if(uchar==*pos++) {
                remainingMatchLength_=--length;
                pos_=pos;
                return (length<0 && (node=*pos)>=kMinValueLead) ?
                        valueResult(node) : USTRINGTRIE_NO_VALUE;
            } else {
                // No match.
                break;
            }
        } else if(node&kValueIsFinal) {
            // No further matching units.
            break;
        } else {
            // Skip intermediate value.
            pos=skipNodeValue(pos, node);
            node&=kNodeTypeMask;
        }
    }
    stop();
    return USTRINGTRIE_NO_MATCH;
}